

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O0

void __thiscall Network::Network(Network *this)

{
  Network_param *this_00;
  Clock *pCVar1;
  Logging *pLVar2;
  long in_RDI;
  
  std::vector<Synapse_*,_std::allocator<Synapse_*>_>::vector
            ((vector<Synapse_*,_std::allocator<Synapse_*>_> *)0x117230);
  this_00 = (Network_param *)operator_new(8);
  this_00->dt = 0.0;
  Network_param::Network_param(this_00);
  *(Network_param **)(in_RDI + 0x18) = this_00;
  std::vector<Population_*,_std::allocator<Population_*>_>::vector
            ((vector<Population_*,_std::allocator<Population_*>_> *)0x117280);
  pCVar1 = Clock::getInstance();
  *(Clock **)(in_RDI + 0x38) = pCVar1;
  pLVar2 = Logging::getInstance();
  *(Logging **)(in_RDI + 0x40) = pLVar2;
  return;
}

Assistant:

Network::Network() : 
    param(new Network_param())
{
    clock = Clock::getInstance();
    logger = Logging::getInstance();
}